

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,RandSequenceStatementSyntax *syntax)

{
  RandSequenceStatementSyntax *scope_00;
  RandSequenceStatementSyntax *this;
  bool bVar1;
  RandSeqProductionSymbol *symbol_00;
  string_view name_00;
  RandSeqProductionSymbol *symbol;
  ProductionSyntax *local_a0;
  ProductionSyntax *prod;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::ProductionSyntax> *__range2;
  Compilation *comp;
  _Storage<slang::ast::VariableLifetime,_true> local_70 [2];
  char *local_68;
  type local_60;
  type local_58;
  StatementBlockSymbol *local_50;
  StatementBlockSymbol *result;
  type *loc;
  type *name;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_30;
  RandSequenceStatementSyntax *local_18;
  RandSequenceStatementSyntax *syntax_local;
  Scope *scope_local;
  
  local_18 = syntax;
  syntax_local = (RandSequenceStatementSyntax *)scope;
  name = (type *)parsing::Token::location(&syntax->randsequence);
  getLabel(&local_30,&syntax->super_StatementSyntax,(SourceLocation)name);
  loc = (type *)std::
                get<0ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                          (&local_30);
  result = (StatementBlockSymbol *)
           std::get<1ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&local_30);
  this = syntax_local;
  scope_00 = local_18;
  local_60 = *loc;
  local_58 = loc[1];
  local_68 = *(char **)&result->super_Symbol;
  comp._4_4_ = 0;
  std::optional<slang::ast::VariableLifetime>::optional<slang::ast::VariableLifetime,_true>
            ((optional<slang::ast::VariableLifetime> *)local_70,
             (VariableLifetime *)((long)&comp + 4));
  name_00._M_str = local_68;
  name_00._M_len = (size_t)local_58;
  local_50 = createBlock((ast *)this,(Scope *)scope_00,(StatementSyntax *)local_60,name_00,
                         (SourceLocation)0x0,local_70[0]._M_value,
                         (optional<slang::ast::VariableLifetime>)syntax);
  __range2 = (SyntaxList<slang::syntax::ProductionSyntax> *)
             Scope::getCompilation((Scope *)syntax_local);
  __begin2 = (iterator)&local_18->productions;
  __end2 = nonstd::span_lite::span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>::begin
                     (&(local_18->productions).
                       super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>);
  prod = (ProductionSyntax *)
         nonstd::span_lite::span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>::end
                   ((span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL> *)
                    (__begin2 + 4));
  for (; (ProductionSyntax *)__end2 != prod; __end2 = __end2 + 1) {
    local_a0 = *__end2;
    _symbol = parsing::Token::valueText(&local_a0->name);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&symbol);
    if (!bVar1) {
      symbol_00 = RandSeqProductionSymbol::fromSyntax((Compilation *)__range2,local_a0);
      Scope::addMember(&local_50->super_Scope,&symbol_00->super_Symbol);
    }
  }
  return local_50;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const RandSequenceStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.randsequence.location());
    auto result = createBlock(scope, syntax, name, loc, StatementBlockKind::Sequential,
                              VariableLifetime::Automatic);

    auto& comp = scope.getCompilation();
    for (auto prod : syntax.productions) {
        if (prod->name.valueText().empty())
            continue;

        auto& symbol = RandSeqProductionSymbol::fromSyntax(comp, *prod);
        result->addMember(symbol);
    }

    return *result;
}